

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.cxx
# Opt level: O3

int __thiscall cmValue::Compare(cmValue *this,cmValue value)

{
  int iVar1;
  
  if (this->Value == (string *)0x0) {
    iVar1 = -(uint)(value.Value != (string *)0x0);
  }
  else if (value.Value == (string *)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = std::__cxx11::string::compare((string *)this->Value);
  }
  return iVar1;
}

Assistant:

int cmValue::Compare(cmValue value) const noexcept
{
  if (this->Value == nullptr && !value) {
    return 0;
  }
  if (this->Value == nullptr) {
    return -1;
  }
  if (!value) {
    return 1;
  }
  return this->Value->compare(*value);
}